

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * status_code_to_str(int status_code)

{
  if (status_code < 400) {
    if (status_code < 200) {
      if (status_code == 100) {
        return "Continue";
      }
      if (status_code == 0x65) {
        return "Switching Protocols";
      }
      if (status_code == 0x66) {
        return "Processing";
      }
    }
    else {
      switch(status_code) {
      case 200:
        return "OK";
      case 0xc9:
        return "Created";
      case 0xca:
        return "Accepted";
      case 0xcb:
        return "Non-Authoritative Information";
      case 0xcc:
        return "No Content";
      case 0xcd:
        return "Reset Content";
      case 0xce:
        return "Partial Content";
      case 0xcf:
        return "Multi-Status";
      case 0xd0:
        return "Already Reported";
      }
      switch(status_code) {
      case 300:
        return "Multiple Choices";
      case 0x12d:
        return "Moved Permanently";
      case 0x12e:
        return "Found";
      case 0x12f:
        return "See Other";
      case 0x130:
        return "Not Modified";
      case 0x131:
        return "Use Proxy";
      case 0x132:
        return "Switch Proxy";
      case 0x133:
        return "Temporary Redirect";
      case 0x134:
        return "Permanent Redirect";
      }
      if (status_code == 0xe2) {
        return "IM Used";
      }
    }
  }
  else {
    switch(status_code) {
    case 400:
      return "Bad Request";
    case 0x191:
      return "Unauthorized";
    case 0x192:
      return "Payment Required";
    case 0x193:
      return "Forbidden";
    case 0x194:
      return "Not Found";
    case 0x195:
      return "Method Not Allowed";
    case 0x196:
      return "Not Acceptable";
    case 0x197:
      return "Proxy Authentication Required";
    case 0x198:
      return "Request Timeout";
    case 0x199:
      return "Conflict";
    case 0x19a:
      return "Gone";
    case 0x19b:
      return "Length Required";
    case 0x19c:
      return "Precondition Failed";
    case 0x19d:
      return "Payload Too Large";
    case 0x19e:
      return "URI Too Long";
    case 0x19f:
      return "Unsupported Media Type";
    case 0x1a0:
      return "Requested Range Not Satisfiable";
    case 0x1a1:
      return "Expectation Failed";
    case 0x1a2:
      return "I\'m a teapot";
    case 0x1a3:
    case 0x1a4:
    case 0x1a5:
    case 0x1a9:
    case 0x1ab:
    case 0x1ae:
    case 0x1b0:
    case 0x1b1:
    case 0x1b2:
    case 0x1b3:
    case 0x1b4:
    case 0x1b5:
    case 0x1b6:
    case 0x1b7:
    case 0x1b8:
    case 0x1b9:
    case 0x1ba:
    case 0x1bb:
    case 0x1bc:
    case 0x1bd:
    case 0x1be:
    case 0x1bf:
    case 0x1c0:
    case 0x1c1:
    case 0x1c2:
      break;
    case 0x1a6:
      return "Unprocessable Entity";
    case 0x1a7:
      return "Locked";
    case 0x1a8:
      return "Failed Dependency";
    case 0x1aa:
      return "Upgrade Required";
    case 0x1ac:
      return "Precondition Required";
    case 0x1ad:
      return "Too Many Requests";
    case 0x1af:
      return "Request Header Fields Too Large";
    case 0x1c3:
      return "Unavailable For Legal Reasons";
    default:
      switch(status_code) {
      case 500:
        return "Internal Server Error";
      case 0x1f5:
        return "Not Implemented";
      case 0x1f6:
        return "Bad Gateway";
      case 0x1f7:
        return "Service Unavailable";
      case 0x1f8:
        return "Gateway Timeout";
      case 0x1f9:
        return "HTTP Version Not Supported";
      case 0x1fa:
        return "Variant Also Negotiates";
      case 0x1fb:
        return "Insufficient Storage";
      case 0x1fc:
        return "Loop Detected";
      case 0x1fe:
        return "Not Extended";
      case 0x1ff:
        return "Network Authentication Required";
      }
    }
  }
  return "Server Error";
}

Assistant:

static const char *status_code_to_str(int status_code) {
  switch (status_code) {

    case 100: return "Continue";
    case 101: return "Switching Protocols";
    case 102: return "Processing";

    case 200: return "OK";
    case 201: return "Created";
    case 202: return "Accepted";
    case 203: return "Non-Authoritative Information";
    case 204: return "No Content";
    case 205: return "Reset Content";
    case 206: return "Partial Content";
    case 207: return "Multi-Status";
    case 208: return "Already Reported";
    case 226: return "IM Used";

    case 300: return "Multiple Choices";
    case 301: return "Moved Permanently";
    case 302: return "Found";
    case 303: return "See Other";
    case 304: return "Not Modified";
    case 305: return "Use Proxy";
    case 306: return "Switch Proxy";
    case 307: return "Temporary Redirect";
    case 308: return "Permanent Redirect";

    case 400: return "Bad Request";
    case 401: return "Unauthorized";
    case 402: return "Payment Required";
    case 403: return "Forbidden";
    case 404: return "Not Found";
    case 405: return "Method Not Allowed";
    case 406: return "Not Acceptable";
    case 407: return "Proxy Authentication Required";
    case 408: return "Request Timeout";
    case 409: return "Conflict";
    case 410: return "Gone";
    case 411: return "Length Required";
    case 412: return "Precondition Failed";
    case 413: return "Payload Too Large";
    case 414: return "URI Too Long";
    case 415: return "Unsupported Media Type";
    case 416: return "Requested Range Not Satisfiable";
    case 417: return "Expectation Failed";
    case 418: return "I\'m a teapot";
    case 422: return "Unprocessable Entity";
    case 423: return "Locked";
    case 424: return "Failed Dependency";
    case 426: return "Upgrade Required";
    case 428: return "Precondition Required";
    case 429: return "Too Many Requests";
    case 431: return "Request Header Fields Too Large";
    case 451: return "Unavailable For Legal Reasons";

    case 500: return "Internal Server Error";
    case 501: return "Not Implemented";
    case 502: return "Bad Gateway";
    case 503: return "Service Unavailable";
    case 504: return "Gateway Timeout";
    case 505: return "HTTP Version Not Supported";
    case 506: return "Variant Also Negotiates";
    case 507: return "Insufficient Storage";
    case 508: return "Loop Detected";
    case 510: return "Not Extended";
    case 511: return "Network Authentication Required";

    default:  return "Server Error";
  }
}